

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::NegativeUniform::Run(NegativeUniform *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  GLint GVar2;
  GLenum GVar3;
  char *format;
  GLint max_image_units;
  GLint ii;
  GLint i;
  GLint local_2c;
  GLint local_28;
  GLint local_24;
  
  GVar1 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nwriteonly uniform image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, vec4(0.0));\n  discard;\n}"
                     ,(bool *)0x0);
  this->m_program = GVar1;
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f38,&local_2c);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,-1);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar3 == 0x501) {
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,local_2c);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar3 == 0x501) {
      local_24 = -3;
      GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
      glu::CallLogWrapper::glUniform1iv(this_00,GVar2,1,&local_24);
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 == 0x501) {
        local_24 = local_2c + 1;
        GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
        glu::CallLogWrapper::glUniform1iv(this_00,GVar2,1,&local_24);
        GVar3 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar3 == 0x501) {
          GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
          glu::CallLogWrapper::glUniform1ui(this_00,GVar2,0);
          GVar3 = glu::CallLogWrapper::glGetError(this_00);
          if (GVar3 == 0x502) {
            GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
            glu::CallLogWrapper::glUniform2i(this_00,GVar2,0,0);
            GVar3 = glu::CallLogWrapper::glGetError(this_00);
            if (GVar3 == 0x502) {
              glu::CallLogWrapper::glUseProgram(this_00,0);
              GVar1 = this->m_program;
              GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image");
              glu::CallLogWrapper::glProgramUniform1i(this_00,GVar1,GVar2,-1);
              GVar3 = glu::CallLogWrapper::glGetError(this_00);
              if (GVar3 == 0x501) {
                GVar1 = this->m_program;
                GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image");
                glu::CallLogWrapper::glProgramUniform1i(this_00,GVar1,GVar2,local_2c);
                GVar3 = glu::CallLogWrapper::glGetError(this_00);
                if (GVar3 == 0x501) {
                  local_28 = -3;
                  GVar1 = this->m_program;
                  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image");
                  glu::CallLogWrapper::glProgramUniform1iv(this_00,GVar1,GVar2,1,&local_28);
                  GVar3 = glu::CallLogWrapper::glGetError(this_00);
                  if (GVar3 == 0x501) {
                    local_28 = local_2c + 1;
                    GVar1 = this->m_program;
                    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image");
                    glu::CallLogWrapper::glProgramUniform1iv(this_00,GVar1,GVar2,1,&local_28);
                    GVar3 = glu::CallLogWrapper::glGetError(this_00);
                    if (GVar3 == 0x501) {
                      GVar1 = this->m_program;
                      GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image");
                      glu::CallLogWrapper::glProgramUniform1ui(this_00,GVar1,GVar2,0);
                      GVar3 = glu::CallLogWrapper::glGetError(this_00);
                      if (GVar3 == 0x502) {
                        GVar1 = this->m_program;
                        GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar1,"g_image");
                        glu::CallLogWrapper::glProgramUniform2i(this_00,GVar1,GVar2,0,0);
                        GVar3 = glu::CallLogWrapper::glGetError(this_00);
                        if (GVar3 == 0x502) {
                          return 0;
                        }
                        format = 
                        "glProgramUniform2i should generate INVALID_OPERATION if the location refers to an image variable.\n"
                        ;
                      }
                      else {
                        format = 
                        "glProgramUniform1ui should generate INVALID_OPERATION if the location refers to an image variable.\n"
                        ;
                      }
                    }
                    else {
                      format = 
                      "glProgramUniform1iv should generate INVALID_VALUE when <value> is greater than or equal to the value of MAX_IMAGE_UNITS.\n"
                      ;
                    }
                  }
                  else {
                    format = 
                    "glProgramUniform1iv should generate INVALID_VALUE when <value> is less than zero.\n"
                    ;
                  }
                }
                else {
                  format = 
                  "glProgramUniform1i should generate INVALID_VALUE when <value> is greater than or equal to the value of MAX_IMAGE_UNITS.\n"
                  ;
                }
              }
              else {
                format = 
                "glProgramUniform1i should generate INVALID_VALUE when <value> is less than zero.\n"
                ;
              }
            }
            else {
              format = 
              "glUniform2i should generate INVALID_OPERATION if the location refers to an image variable.\n"
              ;
            }
          }
          else {
            format = 
            "glUniform1ui should generate INVALID_OPERATION if the location refers to an image variable.\n"
            ;
          }
        }
        else {
          format = 
          "glUniform1iv should generate INVALID_VALUE when <value> is greater than or equal to the value of MAX_IMAGE_UNITS.\n"
          ;
        }
      }
      else {
        format = "glUniform1iv should generate INVALID_VALUE when <value> is less than zero.\n";
      }
    }
    else {
      format = 
      "glUniform1i should generate INVALID_VALUE when <value> is greater than or equal to the value of MAX_IMAGE_UNITS.\n"
      ;
    }
  }
  else {
    format = "glUniform1i should generate INVALID_VALUE when <value> is less than zero.\n";
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							  "  gl_Position = i_position;" NL "}";
		const char* glsl_fs = "#version 420 core" NL "writeonly uniform image2D g_image;" NL "void main() {" NL
							  "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image, coord, vec4(0.0));" NL
							  "  discard;" NL "}";
		m_program = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_fs);

		GLint max_image_units;
		glGetIntegerv(GL_MAX_IMAGE_UNITS, &max_image_units);
		glUseProgram(m_program);

		glUniform1i(glGetUniformLocation(m_program, "g_image"), -1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glUniform1i should generate INVALID_VALUE when <value> is less than zero.\n");
			return ERROR;
		}
		glUniform1i(glGetUniformLocation(m_program, "g_image"), max_image_units);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glUniform1i should generate INVALID_VALUE when <value> is greater than or equal to the value of "
				   "MAX_IMAGE_UNITS.\n");
			return ERROR;
		}

		GLint i = -3;
		glUniform1iv(glGetUniformLocation(m_program, "g_image"), 1, &i);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glUniform1iv should generate INVALID_VALUE when <value> is less than zero.\n");
			return ERROR;
		}
		i = max_image_units + 1;
		glUniform1iv(glGetUniformLocation(m_program, "g_image"), 1, &i);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("glUniform1iv should generate INVALID_VALUE when <value> is greater than or equal to the value of "
				   "MAX_IMAGE_UNITS.\n");
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_image"), 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("glUniform1ui should generate INVALID_OPERATION if the location refers to an image variable.\n");
			return ERROR;
		}
		glUniform2i(glGetUniformLocation(m_program, "g_image"), 0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("glUniform2i should generate INVALID_OPERATION if the location refers to an image variable.\n");
			return ERROR;
		}

		{
			glUseProgram(0);

			glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image"), -1);
			if (glGetError() != GL_INVALID_VALUE)
			{
				Output("glProgramUniform1i should generate INVALID_VALUE when <value> is less than zero.\n");
				return ERROR;
			}
			glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image"), max_image_units);
			if (glGetError() != GL_INVALID_VALUE)
			{
				Output("glProgramUniform1i should generate INVALID_VALUE when <value> is greater than or equal to the "
					   "value of MAX_IMAGE_UNITS.\n");
				return ERROR;
			}

			GLint ii = -3;
			glProgramUniform1iv(m_program, glGetUniformLocation(m_program, "g_image"), 1, &ii);
			if (glGetError() != GL_INVALID_VALUE)
			{
				Output("glProgramUniform1iv should generate INVALID_VALUE when <value> is less than zero.\n");
				return ERROR;
			}
			ii = max_image_units + 1;
			glProgramUniform1iv(m_program, glGetUniformLocation(m_program, "g_image"), 1, &ii);
			if (glGetError() != GL_INVALID_VALUE)
			{
				Output("glProgramUniform1iv should generate INVALID_VALUE when <value> is greater than or equal to the "
					   "value of MAX_IMAGE_UNITS.\n");
				return ERROR;
			}

			glProgramUniform1ui(m_program, glGetUniformLocation(m_program, "g_image"), 0);
			if (glGetError() != GL_INVALID_OPERATION)
			{
				Output("glProgramUniform1ui should generate INVALID_OPERATION if the location refers to an image "
					   "variable.\n");
				return ERROR;
			}
			glProgramUniform2i(m_program, glGetUniformLocation(m_program, "g_image"), 0, 0);
			if (glGetError() != GL_INVALID_OPERATION)
			{
				Output("glProgramUniform2i should generate INVALID_OPERATION if the location refers to an image "
					   "variable.\n");
				return ERROR;
			}
		}

		return NO_ERROR;
	}